

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          char (*params) [7])

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  void *__s1;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint *puVar7;
  size_t sVar8;
  uchar *in_RDX;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(params + 8) != 0) {
    lVar1 = *(long *)params;
    sVar6 = strlen((char *)in_RDX);
    s.size_ = sVar6;
    s.ptr = in_RDX;
    uVar4 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    lVar2 = *(long *)(params[6] + 6);
    uVar3 = *(ulong *)(params + 8);
    uVar9 = (ulong)((int)uVar3 - 1U & uVar4);
    uVar11 = *(uint *)(lVar2 + 4 + uVar9 * 8);
    if (uVar11 != 0) {
      puVar7 = (uint *)(lVar2 + uVar9 * 8);
      uVar13 = 0;
      do {
        if ((uVar11 != 1) && (*puVar7 == uVar4)) {
          lVar12 = (ulong)(uVar11 - 2) * 0x10;
          __s1 = *(void **)(lVar1 + lVar12);
          sVar6 = *(size_t *)(lVar1 + 8 + lVar12);
          sVar8 = strlen((char *)in_RDX);
          if ((sVar6 == sVar8 + 1) &&
             ((sVar6 == 0 || (iVar5 = bcmp(__s1,in_RDX,sVar6), iVar5 == 0)))) {
            uVar13 = lVar12 + *(long *)params;
            break;
          }
        }
        uVar10 = uVar9 + 1;
        uVar9 = uVar10 & 0xffffffff;
        if (uVar10 == uVar3) {
          uVar9 = uVar13;
        }
        puVar7 = (uint *)(lVar2 + uVar9 * 8);
        uVar11 = puVar7[1];
      } while (uVar11 != 0);
      goto LAB_001501f5;
    }
  }
  uVar13 = 0;
LAB_001501f5:
  *(ulong *)this = uVar13;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}